

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

offset_in_TranslateToFuzzReader_to_subr __thiscall
_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
          (void *this,
          FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *picker)

{
  value_type vVar1;
  value_type *pvVar2;
  vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
  local_30;
  
  wasm::Random::items<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
            (&local_30,(Random *)this,picker);
  pvVar2 = wasm::Random::
           pick<std::vector<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),std::allocator<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>>>
                     ((Random *)this,&local_30);
  vVar1 = *pvVar2;
  if (local_30.
      super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return vVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }